

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choices.cpp
# Opt level: O0

long Random::random(void)

{
  result_type_conflict1 rVar1;
  long extraout_RAX;
  undefined1 local_1390 [8];
  random_device rd;
  
  if ((seeded_ & 1) == 0) {
    std::random_device::random_device((random_device *)local_1390);
    rVar1 = std::random_device::operator()((random_device *)local_1390);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)gen_,(ulong)rVar1);
    seeded_ = 1;
    std::random_device::~random_device((random_device *)local_1390);
  }
  std::uniform_real_distribution<double>::operator()
            ((uniform_real_distribution<double> *)dis_,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)gen_);
  return extraout_RAX;
}

Assistant:

double Random::random() {
  if (!seeded_) {
    std::random_device rd;
    gen_.seed(rd());
    seeded_ = true;
  }
  return dis_(gen_);
}